

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclConst<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  string shader_source;
  
  puVar6 = (undefined1 *)&shader_source;
  puVar7 = (undefined1 *)&shader_source;
  puVar3 = (undefined1 *)&shader_source;
  puVar4 = (undefined1 *)&shader_source;
  puVar5 = (undefined1 *)&shader_source;
  puVar8 = (undefined1 *)&shader_source;
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shader_source,
             "const float[2][2] x = float[2][2](float[2](1.0, 2.0), float[2](3.0, 4.0));\n\n","");
  std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
  case COMPUTE_SHADER_TYPE:
  case TESSELATION_EVALUATION_SHADER_TYPE:
    break;
  case VERTEX_SHADER_TYPE:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case GEOMETRY_SHADER_TYPE:
    puVar1 = &emit_quad_abi_cxx11_;
    goto LAB_00b6026e;
  case TESSELATION_CONTROL_SHADER_TYPE:
    puVar1 = &set_tesseation_abi_cxx11_;
LAB_00b6026e:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
    break;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x85f);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    break;
  case VERTEX_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    puVar3 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
    puVar4 = default_tc_shader_source_abi_cxx11_;
    goto LAB_00b6033d;
  case COMPUTE_SHADER_TYPE:
    puVar5 = empty_string_abi_cxx11_;
    puVar4 = empty_string_abi_cxx11_;
    puVar3 = empty_string_abi_cxx11_;
    puVar6 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    goto LAB_00b60344;
  case GEOMETRY_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    puVar3 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
    goto LAB_00b60336;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    puVar7 = default_fragment_shader_source_abi_cxx11_;
    puVar6 = default_geometry_shader_source_abi_cxx11_;
    goto LAB_00b6032f;
  default:
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar2,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x862);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar3 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b6032f:
  puVar4 = default_tc_shader_source_abi_cxx11_;
LAB_00b60336:
  puVar5 = default_vertex_shader_source_abi_cxx11_;
LAB_00b6033d:
  puVar8 = empty_string_abi_cxx11_;
LAB_00b60344:
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,puVar5,puVar4,puVar3,puVar6,puVar7,puVar8,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConst<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source = "const float[2][2] x = float[2][2](float[2](1.0, 2.0), float[2](3.0, 4.0));\n\n";
	shader_source += shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}